

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hadvuv.h
# Opt level: O3

ElementType
advectionDriver(Storage3D field,int64_t i,int64_t j,int64_t k,ElementType uavg,ElementType vavg,
               ElementType eddlat,ElementType eddlon)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (uavg <= 0.0) {
    uavg = -uavg;
    lVar1 = field.strides._M_elems[1] * j;
    lVar2 = field.strides._M_elems[0] * k;
    dVar5 = field.alignedPtr[field.offset + (i + -1) * field.strides._M_elems[2] + lVar1 + lVar2] *
            -0.3333333333333333 +
            field.alignedPtr[field.offset + field.strides._M_elems[2] * i + lVar1 + lVar2] * -0.5 +
            field.alignedPtr[field.offset + (i + 1) * field.strides._M_elems[2] + lVar1 + lVar2];
    dVar4 = field.alignedPtr[field.offset + (i + 2) * field.strides._M_elems[2] + lVar1 + lVar2] *
            -0.16666666666666666;
  }
  else {
    lVar1 = field.strides._M_elems[1] * j;
    lVar2 = field.strides._M_elems[0] * k;
    dVar5 = field.alignedPtr[field.offset + field.strides._M_elems[2] * i + lVar1 + lVar2] * -0.5 +
            field.alignedPtr[field.offset + (i + -2) * field.strides._M_elems[2] + lVar1 + lVar2] *
            -0.16666666666666666 +
            field.alignedPtr[field.offset + (i + -1) * field.strides._M_elems[2] + lVar1 + lVar2];
    dVar4 = field.alignedPtr[field.offset + (i + 1) * field.strides._M_elems[2] + lVar1 + lVar2] *
            -0.3333333333333333;
  }
  if (vavg <= 0.0) {
    vavg = -vavg;
    lVar2 = field.strides._M_elems[2] * i;
    lVar1 = field.strides._M_elems[0] * k;
    dVar6 = field.alignedPtr[field.offset + lVar2 + (j + -1) * field.strides._M_elems[1] + lVar1] *
            -0.3333333333333333 +
            field.alignedPtr[field.offset + lVar2 + field.strides._M_elems[1] * j + lVar1] * -0.5 +
            field.alignedPtr[field.offset + lVar2 + (j + 1) * field.strides._M_elems[1] + lVar1];
    dVar3 = field.alignedPtr[field.offset + lVar2 + (j + 2) * field.strides._M_elems[1] + lVar1] *
            -0.16666666666666666;
  }
  else {
    lVar2 = field.strides._M_elems[2] * i;
    lVar1 = field.strides._M_elems[0] * k;
    dVar6 = field.alignedPtr[field.offset + lVar2 + field.strides._M_elems[1] * j + lVar1] * -0.5 +
            field.alignedPtr[field.offset + lVar2 + (j + -2) * field.strides._M_elems[1] + lVar1] *
            -0.16666666666666666 +
            field.alignedPtr[field.offset + lVar2 + (j + -1) * field.strides._M_elems[1] + lVar1];
    dVar3 = field.alignedPtr[field.offset + lVar2 + (j + 1) * field.strides._M_elems[1] + lVar1] *
            -0.3333333333333333;
  }
  return eddlat * (dVar4 + dVar5) * uavg + (dVar3 + dVar6) * vavg * eddlon;
}

Assistant:

ElementType advectionDriver(const Storage3D field, const int64_t i, const int64_t j, const int64_t k, const ElementType uavg, const ElementType vavg,
                            const ElementType eddlat, const ElementType eddlon) {
  ElementType result_x = 0.0;
  ElementType result_y = 0.0;

  if(uavg > 0) {
    result_x = uavg*
        (ElementType(-1.0)/ElementType(6.0)*field(i-2, j, k) +
                                            field(i-1, j, k) +
                          ElementType(-0.5)*field(i  , j, k) +
         ElementType(-1.0)/ElementType(3.0)*field(i+1, j, k));
  }
  else
  {
    result_x = -uavg*
        (ElementType(-1.0)/ElementType(3.0)*field(i-1, j, k) +
                          ElementType(-0.5)*field(i  , j, k) +
                                            field(i+1, j, k) +
         ElementType(-1.0)/ElementType(6.0)*field(i+2, j, k));
  }

  if(vavg > 0) {
    result_y = vavg*
        (ElementType(-1.0)/ElementType(6.0)*field(i, j-2, k) +
                                            field(i, j-1, k) +
                          ElementType(-0.5)*field(i, j  , k) +
         ElementType(-1.0)/ElementType(3.0)*field(i, j+1, k));
  }
  else
  {
    result_y = -vavg*
        (ElementType(-1.0)/ElementType(3.0)*field(i, j-1, k) +
                          ElementType(-0.5)*field(i, j  , k) +
                                            field(i, j+1, k) +
         ElementType(-1.0)/ElementType(6.0)*field(i, j+2, k));
  }

  return eddlat*result_x + eddlon*result_y;
}